

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

ostream * Logger::Start(LogSeverity severity,string *file,int line,string *function)

{
  ostream *poVar1;
  string *in_RCX;
  int in_EDX;
  string *in_RSI;
  char time_string [128];
  time_t tm;
  char acStackY_a8 [20];
  LogSeverity in_stack_ffffffffffffff6c;
  time_t local_28;
  string *local_20;
  int local_14;
  string *local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  time(&local_28);
  ctime_r(&local_28,acStackY_a8);
  poVar1 = GetStream(in_stack_ffffffffffffff6c);
  poVar1 = std::operator<<(poVar1,acStackY_a8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,local_10);
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_14);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::operator<<(poVar1,local_20);
  poVar1 = std::operator<<(poVar1,") ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::flush<char,std::char_traits<char>>);
  return poVar1;
}

Assistant:

std::ostream& Logger::Start(LogSeverity severity,
                            const std::string& file,
                            int line,
                            const std::string& function) {
  time_t tm;
  time(&tm);
  char time_string[128];
#ifndef _MSC_VER
  ctime_r(&tm, time_string);
#else
  ctime_s(time_string, sizeof(time_string), &tm);
#endif
  return GetStream(severity) << time_string
                             << " " << file << ":" << line
                             << " (" << function << ") " << std::flush;
}